

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access-control.c
# Opt level: O3

void ndn_ac_register_access_request(uint8_t service)

{
  long lVar1;
  
  if (!_ac_initialized) {
    _init_ac_state();
  }
  lVar1 = 0;
  do {
    if (_ac_self_state.access_services[lVar1] == 0xff) {
      _ac_self_state.access_services[lVar1] = service;
      return;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  return;
}

Assistant:

void
ndn_ac_register_access_request(uint8_t service)
{
  if (!_ac_initialized) {
    _init_ac_state();
  }
  for (int i = 0; i < 10; i++) {
    if (_ac_self_state.access_services[i] == NDN_SD_NONE) {
      _ac_self_state.access_services[i] = service;
      return;
    }
  }
}